

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O1

char * StringFromBinary(LPBYTE pbBinary,size_t cbBinary,char *szBuffer)

{
  char *pcVar1;
  long lVar2;
  char *szSaveBuffer;
  size_t i;
  size_t sVar3;
  
  pcVar1 = szBuffer;
  if (cbBinary != 0 && pbBinary != (LPBYTE)0x0) {
    lVar2 = 0;
    sVar3 = 0;
    do {
      szBuffer[sVar3 * 2] = IntToHexChar[pbBinary[sVar3] >> 4];
      szBuffer[sVar3 * 2 + 1] = IntToHexChar[pbBinary[sVar3] & 0xf];
      sVar3 = sVar3 + 1;
      lVar2 = lVar2 + -2;
    } while (cbBinary != sVar3);
    szBuffer = szBuffer + -lVar2;
  }
  *szBuffer = '\0';
  return pcVar1;
}

Assistant:

char * StringFromBinary(LPBYTE pbBinary, size_t cbBinary, char * szBuffer)
{
    char * szSaveBuffer = szBuffer;

    // Verify the binary pointer
    if(pbBinary && cbBinary)
    {
        // Convert the string to the array of MD5
        // Copy the blob data as text
        for(size_t i = 0; i < cbBinary; i++)
        {
            *szBuffer++ = IntToHexChar[pbBinary[0] >> 0x04];
            *szBuffer++ = IntToHexChar[pbBinary[0] & 0x0F];
            pbBinary++;
        }
    }

    // Terminate the string
    *szBuffer = 0;
    return szSaveBuffer;
}